

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O0

cmFileSetVisibility cmFileSetVisibilityFromName(string_view name,cmMakefile *mf)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  undefined1 local_d8 [8];
  string msg;
  cmMakefile *mf_local;
  string_view name_local;
  
  bVar2 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("INTERFACE",9);
  bVar1 = std::operator==(name,bVar2);
  if (bVar1) {
    name_local._M_str._4_4_ = Interface;
  }
  else {
    bVar2 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("PUBLIC",6);
    bVar1 = std::operator==(name,bVar2);
    if (bVar1) {
      name_local._M_str._4_4_ = Public;
    }
    else {
      join_0x00000010_0x00000000_ =
           (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("PRIVATE",7);
      bVar1 = std::operator==(name,join_0x00000010_0x00000000_);
      if (bVar1) {
        name_local._M_str._4_4_ = Private;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_108,"File set visibility \"");
        cmAlphaNum::cmAlphaNum(&local_138,name);
        cmStrCat<char[16]>((string *)local_d8,&local_108,&local_138,
                           (char (*) [16])"\" is not valid.");
        if (mf == (cmMakefile *)0x0) {
          cmSystemTools::Error((string *)local_d8);
        }
        else {
          cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_d8);
        }
        name_local._M_str._4_4_ = Private;
        std::__cxx11::string::~string((string *)local_d8);
      }
    }
  }
  return name_local._M_str._4_4_;
}

Assistant:

cmFileSetVisibility cmFileSetVisibilityFromName(cm::string_view name,
                                                cmMakefile* mf)
{
  if (name == "INTERFACE"_s) {
    return cmFileSetVisibility::Interface;
  }
  if (name == "PUBLIC"_s) {
    return cmFileSetVisibility::Public;
  }
  if (name == "PRIVATE"_s) {
    return cmFileSetVisibility::Private;
  }
  auto msg = cmStrCat("File set visibility \"", name, "\" is not valid.");
  if (mf) {
    mf->IssueMessage(MessageType::FATAL_ERROR, msg);
  } else {
    cmSystemTools::Error(msg);
  }
  return cmFileSetVisibility::Private;
}